

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::~SocketInitiator(SocketInitiator *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_> local_18;
  iterator i;
  SocketInitiator *this_local;
  
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__SocketInitiator_0030d458;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketInitiator_0030d4d8;
  i._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::_Rb_tree_iterator
            (&local_18);
  local_20 = (_Base_ptr)
             std::
             map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
             ::begin(&this->m_connections);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
         ::end(&this->m_connections);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_18);
    if (ppVar2->second != (SocketConnection *)0x0) {
      (*(ppVar2->second->super_Responder)._vptr_Responder[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator++(&local_18);
  }
  local_30 = (_Base_ptr)
             std::
             map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
             ::begin(&this->m_pendingConnections);
  local_18._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
         ::end(&this->m_pendingConnections);
    bVar1 = std::operator!=(&local_18,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_18);
    if (ppVar2->second != (SocketConnection *)0x0) {
      (*(ppVar2->second->super_Responder)._vptr_Responder[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator++(&local_18);
  }
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~map(&this->m_connections);
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~map(&this->m_pendingConnections);
  SocketConnector::~SocketConnector(&this->m_connector);
  std::
  map<FIX::SessionID,_int,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::~map(&this->m_sessionToHostNum);
  SessionSettings::~SessionSettings(&this->m_settings);
  SocketConnector::Strategy::~Strategy(&this->super_Strategy);
  Initiator::~Initiator(&this->super_Initiator);
  return;
}

Assistant:

SocketInitiator::~SocketInitiator()
{
  SocketConnections::iterator i;
  for (i = m_connections.begin();
       i != m_connections.end(); ++i)
    delete i->second;

  for (i = m_pendingConnections.begin();
       i != m_pendingConnections.end(); ++i)
    delete i->second;
}